

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

Symbol * sym_AddLocalLabel(char *symName)

{
  char *pcVar1;
  char *pcVar2;
  Symbol *pSVar3;
  bool bVar4;
  char *localName;
  char fullName [256];
  char *symName_local;
  
  bVar4 = true;
  fullName._248_8_ = symName;
  if (labelScope != (char *)0x0) {
    pcVar1 = strchr(labelScope,0x2e);
    bVar4 = pcVar1 == (char *)0x0;
  }
  if (!bVar4) {
    __assert_fail("!labelScope || !strchr(labelScope, \'.\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x1e0,"sym_AddLocalLabel");
  }
  pcVar1 = strchr((char *)fullName._248_8_,0x2e);
  if (pcVar1 == (char *)0x0) {
    __assert_fail("localName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x1e5,"sym_AddLocalLabel");
  }
  if (pcVar1[1] != '\0') {
    pcVar2 = strchr(pcVar1 + 1,0x2e);
    if (pcVar2 != (char *)0x0) {
      fatalerror("\'%s\' is a nonsensical reference to a nested local label\n",fullName._248_8_);
    }
    if (pcVar1 == (char *)fullName._248_8_) {
      if (labelScope == (char *)0x0) {
        error("Unqualified local label \'%s\' in main scope\n",fullName._248_8_);
        return (Symbol *)0x0;
      }
      fullSymbolName((char *)&localName,0x100,(char *)fullName._248_8_,labelScope);
      fullName._248_8_ = &localName;
    }
    pSVar3 = addLabel((char *)fullName._248_8_);
    return pSVar3;
  }
  fatalerror("\'%s\' is a nonsensical reference to an empty local label\n",fullName._248_8_);
}

Assistant:

struct Symbol *sym_AddLocalLabel(char const *symName)
{
	// Assuming no dots in `labelScope` if defined
	assert(!labelScope || !strchr(labelScope, '.'));

	char fullName[MAXSYMLEN + 1];
	char const *localName = strchr(symName, '.');

	assert(localName); // There should be at least one dot in `symName`

	// Check for something after the dot in `localName`
	if (localName[1] == '\0') {
		fatalerror("'%s' is a nonsensical reference to an empty local label\n",
			   symName);
	}
	// Check for more than one dot in `localName`
	if (strchr(localName + 1, '.'))
		fatalerror("'%s' is a nonsensical reference to a nested local label\n",
			   symName);

	if (localName == symName) {
		if (!labelScope) {
			error("Unqualified local label '%s' in main scope\n", symName);
			return NULL;
		}
		// Expand `symName` to the full `labelScope.symName` name
		fullSymbolName(fullName, sizeof(fullName), symName, labelScope);
		symName = fullName;
	}

	return addLabel(symName);
}